

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_38e3a9::ClosureTypeName::printLeft(ClosureTypeName *this,OutputStream *S)

{
  StringView R;
  StringView R_00;
  StringView R_01;
  
  R.Last = "";
  R.First = "\'lambda";
  OutputStream::operator+=(S,R);
  OutputStream::operator+=(S,this->Count);
  R_00.Last = "";
  R_00.First = "\'(";
  OutputStream::operator+=(S,R_00);
  NodeArray::printWithComma(&this->Params,S);
  R_01.Last = "";
  R_01.First = ")";
  OutputStream::operator+=(S,R_01);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "\'lambda";
    S += Count;
    S += "\'(";
    Params.printWithComma(S);
    S += ")";
  }